

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void __thiscall Bitmap::invert(Bitmap *this,int x1,int y1,int x2,int y2)

{
  int y;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)x1;
  if (x1 < 1) {
    uVar3 = 0;
  }
  iVar1 = 0;
  if (0 < y1) {
    iVar1 = y1;
  }
  if (this->width < x2) {
    x2 = this->width;
  }
  if (this->height < y2) {
    y2 = this->height;
  }
  for (; uVar2 = uVar3, iVar1 < y2; iVar1 = iVar1 + 1) {
    for (; (int)uVar2 < x2; uVar2 = uVar2 + 1) {
      this->buffer[uVar2 + (long)iVar1 * (long)this->width] =
           ~this->buffer[uVar2 + (long)iVar1 * (long)this->width];
    }
  }
  return;
}

Assistant:

void
Bitmap::invert(int x1, int y1, int x2, int y2)
{
  x1 = std::max(0, x1);
  y1 = std::max(0, y1);

  x2 = std::min(width,  x2);
  y2 = std::min(height, y2);

  for(int y = y1; y < y2; ++y)
    for(int x = x1; x < x2; ++x)
    {
      buffer[y * width + x] = 255 - buffer[y * width + x];
    }
}